

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowFontSelector(char *label)

{
  ImGuiIO *label_00;
  bool bVar1;
  char *pcVar2;
  ImFont **ppIVar3;
  ImVec2 local_38;
  ImFont *local_30;
  ImFont *font;
  ImFont *pIStack_20;
  int n;
  ImFont *font_current;
  ImGuiIO *io;
  char *label_local;
  
  io = (ImGuiIO *)label;
  font_current = (ImFont *)GetIO();
  pIStack_20 = GetFont();
  label_00 = io;
  pcVar2 = ImFont::GetDebugName(pIStack_20);
  bVar1 = BeginCombo((char *)label_00,pcVar2,0);
  if (bVar1) {
    for (font._4_4_ = 0; font._4_4_ < *(int *)(*(long *)&font_current[1].Glyphs + 0x40);
        font._4_4_ = font._4_4_ + 1) {
      ppIVar3 = ImVector<ImFont_*>::operator[]
                          ((ImVector<ImFont_*> *)(*(long *)&font_current[1].Glyphs + 0x40),
                           font._4_4_);
      local_30 = *ppIVar3;
      PushID(local_30);
      pcVar2 = ImFont::GetDebugName(local_30);
      bVar1 = local_30 == pIStack_20;
      ImVec2::ImVec2(&local_38,0.0,0.0);
      bVar1 = Selectable(pcVar2,bVar1,0,&local_38);
      if (bVar1) {
        font_current[1].FallbackGlyph = (ImFontGlyph *)local_30;
      }
      PopID();
    }
    EndCombo();
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "- Load additional fonts with io.Fonts->AddFontFromFileTTF().\n- The font atlas is built when calling io.Fonts->GetTexDataAsXXXX() or io.Fonts->Build().\n- Read FAQ and docs/FONTS.txt for more details.\n- If you need to add/remove fonts at runtime (e.g. for DPI change), do it before calling NewFrame()."
            );
  return;
}

Assistant:

void ImGui::ShowFontSelector(const char* label)
{
    ImGuiIO& io = ImGui::GetIO();
    ImFont* font_current = ImGui::GetFont();
    if (ImGui::BeginCombo(label, font_current->GetDebugName()))
    {
        for (int n = 0; n < io.Fonts->Fonts.Size; n++)
        {
            ImFont* font = io.Fonts->Fonts[n];
            ImGui::PushID((void*)font);
            if (ImGui::Selectable(font->GetDebugName(), font == font_current))
                io.FontDefault = font;
            ImGui::PopID();
        }
        ImGui::EndCombo();
    }
    ImGui::SameLine();
    HelpMarker(
        "- Load additional fonts with io.Fonts->AddFontFromFileTTF().\n"
        "- The font atlas is built when calling io.Fonts->GetTexDataAsXXXX() or io.Fonts->Build().\n"
        "- Read FAQ and docs/FONTS.txt for more details.\n"
        "- If you need to add/remove fonts at runtime (e.g. for DPI change), do it before calling NewFrame().");
}